

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimerinfo_unix.cpp
# Opt level: O0

QList<QAbstractEventDispatcher::TimerInfoV2> * __thiscall
QTimerInfoList::registeredTimers(QTimerInfoList *this,QObject *object)

{
  undefined1 uVar1;
  const_iterator o;
  QTimerInfo **ppQVar2;
  QObject *in_RDX;
  QList<QAbstractEventDispatcher::TimerInfoV2> *in_RDI;
  long in_FS_OFFSET;
  QTimerInfo **t;
  QList<QTimerInfo_*> *__range1;
  QList<QAbstractEventDispatcher::TimerInfoV2> *list;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QTimerInfo_*> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff70;
  QList<QAbstractEventDispatcher::TimerInfoV2> *this_00;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (TimerInfoV2 *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QAbstractEventDispatcher::TimerInfoV2>::QList
            ((QList<QAbstractEventDispatcher::TimerInfoV2> *)0x6ae85c);
  local_10.i = (QTimerInfo **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QTimerInfo_*>::begin(in_stack_ffffffffffffff60);
  o = QList<QTimerInfo_*>::end(in_stack_ffffffffffffff60);
  while (uVar1 = QList<QTimerInfo_*>::const_iterator::operator!=(&local_10,o), (bool)uVar1) {
    ppQVar2 = QList<QTimerInfo_*>::const_iterator::operator*(&local_10);
    if ((*ppQVar2)->obj == in_RDX) {
      QList<QAbstractEventDispatcher::TimerInfoV2>::
      emplaceBack<QAbstractEventDispatcher::TimerInfoV2>
                (this_00,(TimerInfoV2 *)CONCAT17(uVar1,in_stack_ffffffffffffff70));
    }
    QList<QTimerInfo_*>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

auto QTimerInfoList::registeredTimers(QObject *object) const -> QList<TimerInfo>
{
    QList<TimerInfo> list;
    for (const auto &t : timers) {
        if (t->obj == object)
            list.emplaceBack(TimerInfo{t->interval, t->id, t->timerType});
    }
    return list;
}